

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O0

int __thiscall ncnn::InstanceNorm::load_model(InstanceNorm *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  Mat *in_RDI;
  Mat *in_stack_ffffffffffffff40;
  Mat *m;
  Mat local_a8;
  undefined1 local_58 [64];
  long *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(local_58,in_RSI,*(undefined4 *)&in_RDI[2].data,1);
  Mat::operator=(in_RDI,in_stack_ffffffffffffff40);
  Mat::~Mat((Mat *)0x1bad0c);
  bVar1 = Mat::empty(in_stack_ffffffffffffff40);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    m = &local_a8;
    (**(code **)(*local_18 + 0x10))(m,local_18,*(undefined4 *)&in_RDI[2].data,1);
    Mat::operator=(in_RDI,m);
    Mat::~Mat((Mat *)0x1bad9d);
    bVar1 = Mat::empty(m);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int InstanceNorm::load_model(const ModelBin& mb)
{
    gamma_data = mb.load(channels, 1);
    if (gamma_data.empty())
        return -100;

    beta_data = mb.load(channels, 1);
    if (beta_data.empty())
        return -100;

    return 0;
}